

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::EndExecution(FunctionBody *this)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->m_DEBUG_executionCount < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x524,"(m_DEBUG_executionCount > 0)",
                                "Must have a previous execution to end");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this->m_DEBUG_executionCount = this->m_DEBUG_executionCount + -1;
  LOCK();
  pTVar1 = &this->m_depth;
  *pTVar1 = *pTVar1 - 1;
  UNLOCK();
  if ((*pTVar1 == 0) && ((char)*(uint *)&this->field_0x178 < '\0')) {
    *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffff7f;
    ReleaseLoopHeaders(this);
    return;
  }
  return;
}

Assistant:

void
    FunctionBody::EndExecution()
    {
#if DBG
        AssertMsg(m_DEBUG_executionCount > 0, "Must have a previous execution to end");

        m_DEBUG_executionCount--;
#endif
        uint depth = ::InterlockedDecrement(&this->m_depth);

        // If loop headers were determined to be no longer needed
        // during the execution of the function, we release them now
        if (depth == 0 && this->m_pendingLoopHeaderRelease)
        {
            this->m_pendingLoopHeaderRelease = false;
            ReleaseLoopHeaders();
        }
    }